

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int parse_fn_args_body(Parser *psr)

{
  Lexer *lxr;
  int iVar1;
  FnScope scope;
  FnScope local_30;
  
  iVar1 = vm_new_fn(psr->vm,psr->pkg);
  local_30.first_local = psr->locals_count;
  local_30.next_slot = 0;
  local_30.outer_scope = psr->scope;
  psr->scope = &local_30;
  lxr = &psr->lxr;
  local_30.fn = iVar1;
  lex_expect(lxr,0x28);
  do {
    lex_next(lxr);
    if ((psr->lxr).tk.type != 0x114) break;
    psr_new_local(psr,(psr->lxr).tk.field_4.ident_hash);
    local_30.next_slot = local_30.next_slot + 1;
    lex_next(lxr);
  } while ((psr->lxr).tk.type == 0x2c);
  lex_expect(lxr,0x29);
  lex_next(lxr);
  lex_expect(lxr,0x7b);
  lex_next(lxr);
  parse_block(psr);
  lex_expect(lxr,0x7d);
  lex_next(lxr);
  fn_emit(psr->vm->fns + psr->scope->fn,0x20);
  psr->locals_count = local_30.first_local;
  psr->scope = local_30.outer_scope;
  return iVar1;
}

Assistant:

static int parse_fn_args_body(Parser *psr) {
	// Create a new function
	int fn_idx = vm_new_fn(psr->vm, psr->pkg);

	// Create the new function scope
	FnScope scope;
	scope.fn = fn_idx;
	scope.first_local = psr->locals_count;
	scope.next_slot = 0;
	scope.outer_scope = psr->scope;
	psr->scope = &scope;

	// Expect the argument list, adding each one as a new local
	lex_expect(&psr->lxr, '(');
	lex_next(&psr->lxr);
	while (psr->lxr.tk.type == TK_IDENT) {
		// Add the argument as a local
		uint64_t arg_name = psr->lxr.tk.ident_hash;
		psr_new_local(psr, arg_name);
		scope.next_slot++;
		lex_next(&psr->lxr);

		// Expect a comma or closing parenthesis
		if (psr->lxr.tk.type != ',') {
			break;
		} else {
			// Skip the comma
			lex_next(&psr->lxr);
		}
	}
	lex_expect(&psr->lxr, ')');
	lex_next(&psr->lxr);

	// Parse the contents of the function definition
	lex_expect(&psr->lxr, '{');
	lex_next(&psr->lxr);
	parse_block(psr);
	lex_expect(&psr->lxr, '}');
	lex_next(&psr->lxr);

	// Add the final RET instruction
	fn_emit(psr_fn(psr), bc_new3(BC_RET, 0, 0, 0));

	// Get rid of the function definition arguments on the parser's locals list
	psr->locals_count = scope.first_local;

	// Return to the outer function scope
	psr->scope = scope.outer_scope;
	return fn_idx;
}